

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::ExpandRegistryValues(string *source,KeyWOW64 param_2)

{
  bool bVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string key;
  string reg;
  RegularExpression regEntry;
  undefined1 *local_358;
  undefined8 local_350;
  undefined1 local_348;
  undefined7 uStack_347;
  string local_338;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_318;
  undefined8 local_300;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined1 *local_2c0;
  undefined1 local_2b8 [32];
  undefined8 local_298;
  undefined8 local_290;
  char *local_288;
  char local_280 [32];
  RegularExpression local_260;
  
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  cmsys::RegularExpression::compile(&local_260,"\\[(HKEY[^]]*)\\]");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find
                      (&local_260,(source->_M_dataplus)._M_p,&local_260.regmatch);
    if (!bVar1) break;
    if (local_260.regmatch.startp[1] == (char *)0x0) {
      local_358 = &local_348;
      local_350 = 0;
      local_348 = 0;
    }
    else {
      local_358 = &local_348;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_358,local_260.regmatch.startp[1],local_260.regmatch.endp[1]);
    }
    local_298 = 0;
    local_290 = 1;
    local_280[0] = '[';
    local_318.first._M_len = 1;
    local_318.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_300 = local_350;
    local_2f8 = local_358;
    local_2f0 = 0;
    local_2d0 = 0;
    local_2c8 = 1;
    local_2b8[0] = 0x5d;
    local_2e8 = 1;
    local_2d8 = 0;
    views._M_len = 3;
    views._M_array = &local_318;
    local_318.first._M_str = local_280;
    local_2e0 = local_2b8;
    local_2c0 = local_2b8;
    local_288 = local_280;
    cmCatViews(&local_338,views);
    cmsys::SystemTools::ReplaceString(source,local_338._M_dataplus._M_p,"/registry");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if (local_358 != &local_348) {
      operator_delete(local_358,CONCAT71(uStack_347,local_348) + 1);
    }
  }
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = cmStrCat('[', key, ']');
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}